

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commodities.cpp
# Opt level: O3

uint32_t units::getCommodity(string *comm)

{
  pointer pcVar1;
  int iVar2;
  ulong uVar3;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  _Var4;
  char *pcVar5;
  byte bVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  uint32_t code;
  char *pcVar10;
  uint32_t uVar11;
  string *comm_00;
  long lVar12;
  ulong uVar13;
  char cVar14;
  size_type sVar15;
  size_type sVar16;
  long *local_40 [2];
  long local_30 [2];
  
  uVar3 = std::__cxx11::string::find((char)comm,0x5c);
  sVar15 = comm->_M_string_length;
  if (uVar3 < sVar15 - 1) {
    do {
      bVar6 = (comm->_M_dataplus)._M_p[uVar3 + 1];
      uVar7 = bVar6 - 0x5b;
      if (((uVar7 < 0x23) && ((0x500000007U >> ((ulong)uVar7 & 0x3f) & 1) != 0)) ||
         (bVar6 - 0x28 < 2)) {
        std::__cxx11::string::erase((ulong)comm,uVar3);
      }
      uVar3 = std::__cxx11::string::find((char)comm,0x5c);
      sVar15 = comm->_M_string_length;
    } while (uVar3 < sVar15 - 1);
  }
  if (sVar15 != 0) {
    pcVar1 = (comm->_M_dataplus)._M_p;
    sVar16 = 0;
    do {
      iVar2 = tolower((int)pcVar1[sVar16]);
      pcVar1[sVar16] = (char)iVar2;
      sVar16 = sVar16 + 1;
    } while (sVar15 != sVar16);
  }
  if (((((_ZN5unitsL22allowCustomCommoditiesE_0 & 1) != 0) &&
       (customCommodityCodes_abi_cxx11_._24_8_ != 0)) &&
      (_Var4._M_cur = (__node_type *)
                      std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)customCommodityCodes_abi_cxx11_,comm),
      _Var4._M_cur != (__node_type *)0x0)) ||
     (_Var4._M_cur = (__node_type *)
                     std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)commodities::commodity_codes_abi_cxx11_,comm),
     _Var4._M_cur != (__node_type *)0x0)) {
    return *(uint32_t *)
            ((long)&((_Var4._M_cur)->
                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                    ._M_storage._M_storage + 0x20);
  }
  iVar2 = std::__cxx11::string::compare((ulong)comm,0,(char *)0x7);
  if (iVar2 == 0) {
    uVar3 = strtoul((comm->_M_dataplus)._M_p + 7,(char **)0x0,0);
    return (uint32_t)uVar3;
  }
  pcVar5 = (comm->_M_dataplus)._M_p;
  uVar3 = comm->_M_string_length;
  pcVar10 = pcVar5 + uVar3;
  if (uVar3 < 6) {
    pcVar8 = pcVar5;
    if (uVar3 < 4) {
LAB_00173a62:
      lVar12 = (long)pcVar10 - (long)pcVar8;
      if (lVar12 == 1) {
LAB_00173ac4:
        pcVar9 = pcVar8;
        if (0xe0 < (byte)(*pcVar8 + 0x82U)) {
          pcVar9 = pcVar10;
        }
        if (*pcVar8 == ' ') {
          pcVar9 = pcVar10;
        }
        goto LAB_00173b6f;
      }
      if (lVar12 == 2) {
LAB_00173aa1:
        pcVar9 = pcVar8;
        if (*pcVar8 != ' ' && (byte)(*pcVar8 + 0x82U) < 0xe1) goto LAB_00173b6f;
        pcVar8 = pcVar8 + 1;
        goto LAB_00173ac4;
      }
      if (lVar12 == 3) {
        pcVar9 = pcVar8;
        if (*pcVar8 != ' ' && (byte)(*pcVar8 + 0x82U) < 0xe1) goto LAB_00173b6f;
        pcVar8 = pcVar8 + 1;
        goto LAB_00173aa1;
      }
    }
    else {
      pcVar9 = pcVar5;
      if (*pcVar5 == ' ' || 0xe0 < (byte)(*pcVar5 + 0x82U)) {
        if (pcVar5[1] == ' ' || 0xe0 < (byte)(pcVar5[1] + 0x82U)) {
          if (pcVar5[2] == ' ' || 0xe0 < (byte)(pcVar5[2] + 0x82U)) {
            if (pcVar5[3] == ' ' || 0xe0 < (byte)(pcVar5[3] + 0x82U)) {
              pcVar8 = pcVar5 + ((uint)uVar3 & 4);
              goto LAB_00173a62;
            }
            pcVar9 = pcVar5 + 3;
          }
          else {
            pcVar9 = pcVar5 + 2;
          }
        }
        else {
          pcVar9 = pcVar5 + 1;
        }
      }
LAB_00173b6f:
      if (pcVar9 != pcVar10) {
        if (uVar3 != 0) goto LAB_00173b81;
        comm_00 = (string *)0x60000025;
        goto LAB_00173bae;
      }
    }
    if (uVar3 == 0) {
      uVar11 = 0x40000000;
    }
    else {
      uVar11 = 0x40000000;
      uVar13 = 0;
      bVar6 = 0;
      do {
        cVar14 = pcVar5[uVar13] + -0x5f;
        if (pcVar5[uVar13] == ' ') {
          cVar14 = '\0';
        }
        uVar11 = uVar11 + ((int)cVar14 << (bVar6 & 0x1f));
        bVar6 = bVar6 + 5;
        uVar13 = uVar13 + 1;
      } while (uVar3 != uVar13);
    }
  }
  else {
LAB_00173b81:
    pcVar10 = pcVar5 + uVar3;
    uVar7 = 0x25;
    do {
      uVar7 = *pcVar5 * 0x12ca3 ^ uVar7 * 0xd32b;
      pcVar5 = pcVar5 + 1;
    } while (pcVar5 != pcVar10);
    comm_00 = (string *)(ulong)(uVar7 & 0x1fffffff | 0x60000000);
LAB_00173bae:
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char*>((string *)local_40);
    uVar11 = (uint32_t)comm_00;
    addCustomCommodity((units *)local_40,comm_00,code);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return uVar11;
}

Assistant:

uint32_t getCommodity(std::string comm)
{
    removeEscapeSequences(comm);
    std::transform(comm.begin(), comm.end(), comm.begin(), ::tolower);
    if (allowCustomCommodities.load(std::memory_order_acquire)) {
        if (!customCommodityCodes.empty()) {
            auto fnd2 = customCommodityCodes.find(comm);
            if (fnd2 != customCommodityCodes.end()) {
                return fnd2->second;
            }
        }
    }

    auto fnd = commodities::commodity_codes.find(comm);
    if (fnd != commodities::commodity_codes.end()) {
        return fnd->second;
    }

    if (comm.compare(0, 7, "cxcomm[") == 0) {
        return strtoul(comm.c_str() + 7, nullptr, 0);
    }
    if ((comm.size() < 6) && std::all_of(comm.begin(), comm.end(), [](char x) {
            return (x == ' ' || (x >= '_' && x <= '}'));
        })) {
        std::uint32_t hkey{0x40000000};
        unsigned int shift{0};
        for (auto c : comm) {
            if (c == ' ') {
                c = '_';
            }
            c -= '_';
            hkey += static_cast<std::uint32_t>(c) << shift;
            shift += 5;
        }
        return hkey;
    }
    // generate a hash code for a custom string
    auto hcode = stringHash(comm);
    hcode &= 0x1FFFFFFFU;
    hcode |= 0x60000000U;
    addCustomCommodity(comm, hcode);

    return hcode;
}